

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::ReplicatedAssignmentPatternSyntax::setChild
          (ReplicatedAssignmentPatternSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00477810 + *(int *)(&DAT_00477810 + index * 4)))();
  return;
}

Assistant:

void ReplicatedAssignmentPatternSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openBrace = child.token(); return;
        case 1: countExpr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 2: innerOpenBrace = child.token(); return;
        case 3: items = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 4: innerCloseBrace = child.token(); return;
        case 5: closeBrace = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}